

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

bool __thiscall ON_Xform::IsValidAndNotZeroAndNotIdentity(ON_Xform *this,double zero_tolerance)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  double *pdVar9;
  double *pdVar10;
  uint uVar11;
  bool bVar12;
  
  uVar3 = 0;
  do {
    uVar7 = uVar3;
    if (0x7f < uVar7) goto LAB_006875c8;
    uVar3 = uVar7 + 8;
  } while (ABS(*(double *)((long)this->m_xform[0] + uVar7)) < 1.23432101234321e+308);
  if (uVar7 < 0x80) {
    bVar4 = false;
  }
  else {
LAB_006875c8:
    bVar4 = false;
    if ((0.0 <= zero_tolerance) && (zero_tolerance < 1.23432101234321e+308)) {
      lVar5 = 0;
      bVar12 = false;
      uVar11 = 0;
      iVar6 = 0;
      iVar8 = 0;
      pdVar9 = (double *)this;
      do {
        dVar1 = *(double *)((long)this->m_xform[0] + lVar5);
        if (ABS(1.0 - dVar1) <= zero_tolerance) {
          iVar8 = iVar8 + 1;
          iVar2 = iVar6;
        }
        else {
          if (zero_tolerance < ABS(dVar1)) {
            pdVar10 = (double *)((long)this->m_xform[0] + lVar5);
            break;
          }
          iVar6 = iVar6 + 1;
          iVar2 = iVar8;
        }
        pdVar10 = pdVar9;
        if (0 < iVar2) break;
        if (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar5 + 8))) {
          pdVar10 = (double *)((long)this->m_xform[0] + lVar5 + 0x10);
          break;
        }
        if (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar5 + 0x10))) {
          pdVar10 = (double *)((long)this->m_xform[0] + lVar5 + 0x18);
          break;
        }
        if (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar5 + 0x18))) {
          pdVar10 = (double *)((long)this->m_xform[1] + lVar5);
          break;
        }
        if (zero_tolerance < ABS(*(double *)((long)this->m_xform[1] + lVar5))) {
          pdVar10 = (double *)((long)this->m_xform[1] + lVar5 + 8);
          break;
        }
        pdVar9 = pdVar9 + 5;
        bVar12 = 1 < uVar11;
        uVar11 = uVar11 + 1;
        lVar5 = lVar5 + 0x28;
        pdVar10 = this->m_xform[3] + 3;
      } while ((int)lVar5 != 0x78);
      bVar4 = true;
      if ((bVar12) && (ABS(1.0 - *pdVar10) <= zero_tolerance)) {
        return iVar6 != 3 && iVar8 != 3;
      }
    }
  }
  return bVar4;
}

Assistant:

bool ON_Xform::IsValidAndNotZeroAndNotIdentity(
  double zero_tolerance
) const
{
  if (false == IsValid())
    return false;

  if (!(zero_tolerance >= 0.0 && zero_tolerance < ON_UNSET_POSITIVE_VALUE))
    return false;

  int one_count = 0;
  int zero_count = 0;
  const double* v = &m_xform[0][0];
  for ( int i = 0; i < 3; i++ )
  {
    if (fabs(1.0 - *v) <= zero_tolerance)
    {
      // this diagonal coefficient = 1
      one_count++;
      if (zero_count > 0)
        return true;
    }
    else if (fabs(*v) <= zero_tolerance)
    {
      // this diagonal coefficient = 0
      zero_count++;
      if (one_count > 0)
        return true;
    }
    else
    {
      // this diagonal coefficient != 1 and != 0
      return true;
    }

    // If any off diagonal coefficient is not zero, return true
    v++;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
  }

  if (!(fabs(1.0 - *v) <= zero_tolerance))
  {
    if (3 == zero_count && fabs(1.0 - *v) <= zero_tolerance)
      return false; // every matrix coefficient = 0

    // otherwise, xform[3][3] != 1 so return true.
    return true;
  }

  if (3 == one_count || 3 == zero_count)
    return false;

  return true;
}